

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O1

void alGenEffects(ALsizei n,ALuint *effects)

{
  pointer *ppEVar1;
  ALCdevice *device;
  pointer pEVar2;
  ulong __n;
  pointer ptr;
  int iVar3;
  ulong uVar4;
  ALeffect *pAVar5;
  pointer pEVar6;
  char *pcVar7;
  ulong uVar8;
  ContextRef context;
  vector<ALuint> ids;
  ALCcontext *local_70;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_48;
  
  __n = (ulong)(uint)n;
  GetContextRef();
  if (local_70 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_70,0xa003,"Generating %d effects",__n);
    }
    if (0 < n) {
      device = (local_70->mDevice).mPtr;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&device->EffectLock);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pEVar6 = (device->EffectList).
               super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar2 = (device->EffectList).
               super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar6 == pEVar2) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          uVar8 = pEVar6->FreeMask - (pEVar6->FreeMask >> 1 & 0x5555555555555555);
          uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
          uVar4 = uVar4 + (((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
          pEVar6 = pEVar6 + 1;
        } while (pEVar6 != pEVar2);
      }
      ppEVar1 = &(device->EffectList).
                 super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (; uVar4 < __n; uVar4 = uVar4 + 0x40) {
        if (0x1ffffff0 <
            (ulong)((long)*ppEVar1 -
                   (long)(device->EffectList).
                         super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
LAB_0011d46a:
          if (uVar4 < __n) {
            pcVar7 = "s";
            if (n == 1) {
              pcVar7 = "";
            }
            ALCcontext::setError
                      (local_70,0xa005,"Failed to allocate %d effect%s",(ulong)(uint)n,pcVar7);
            goto LAB_0011d4c9;
          }
          break;
        }
        std::vector<EffectSubList,_al::allocator<EffectSubList,_8UL>_>::emplace_back<>
                  (&device->EffectList);
        pEVar6 = *ppEVar1;
        pEVar6[-1].FreeMask = 0xffffffffffffffff;
        pAVar5 = (ALeffect *)al_calloc(8,0x2000);
        pEVar6[-1].Effects = pAVar5;
        if (pAVar5 == (ALeffect *)0x0) {
          alGenEffects_cold_1();
          goto LAB_0011d46a;
        }
      }
      if (n == 1) {
        pAVar5 = anon_unknown.dwarf_25b5c::AllocEffect(device);
        *effects = pAVar5->id;
      }
      else {
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_48,__n);
        do {
          pAVar5 = anon_unknown.dwarf_25b5c::AllocEffect(device);
          if (local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
            _M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&pAVar5->id);
          }
          else {
            *local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
             super__Vector_impl_data._M_finish = pAVar5->id;
            local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          ptr = local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_start;
          n = n + -1;
        } while (n != 0);
        if ((long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(effects,local_48.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        }
        if (ptr != (pointer)0x0) {
          al_free(ptr);
        }
      }
LAB_0011d4c9:
      pthread_mutex_unlock((pthread_mutex_t *)&device->EffectLock);
    }
  }
  if (local_70 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_70->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenEffects(ALsizei n, ALuint *effects)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effects", n);
    if UNLIKELY(n <= 0) return;

    ALCdevice *device{context->mDevice.get()};
    std::lock_guard<std::mutex> _{device->EffectLock};
    if(!EnsureEffects(device, static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effect%s", n, (n==1)?"":"s");
        return;
    }

    if LIKELY(n == 1)
    {
        /* Special handling for the easy and normal case. */
        ALeffect *effect{AllocEffect(device)};
        effects[0] = effect->id;
    }
    else
    {
        /* Store the allocated buffer IDs in a separate local list, to avoid
         * modifying the user storage in case of failure.
         */
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALeffect *effect{AllocEffect(device)};
            ids.emplace_back(effect->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), effects);
    }